

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obmc_variance_test.cc
# Opt level: O0

void __thiscall
(anonymous_namespace)::ObmcVarianceTest_RandomValues_Test::~ObmcVarianceTest_RandomValues_Test
          (ObmcVarianceTest_RandomValues_Test *this)

{
  ObmcVarianceTest_RandomValues_Test *in_stack_00000010;
  
  anon_unknown.dwarf_13792d8::ObmcVarianceTest_RandomValues_Test::
  ~ObmcVarianceTest_RandomValues_Test(in_stack_00000010);
  return;
}

Assistant:

TEST_P(ObmcVarianceTest, RandomValues) {
  DECLARE_ALIGNED(32, uint8_t, pre[MAX_SB_SQUARE]);
  DECLARE_ALIGNED(32, int32_t, wsrc[MAX_SB_SQUARE]);
  DECLARE_ALIGNED(32, int32_t, mask[MAX_SB_SQUARE]);

  for (int iter = 0; iter < kIterations && !HasFatalFailure(); ++iter) {
    const int pre_stride = this->rng_(MAX_SB_SIZE + 1);

    for (int i = 0; i < MAX_SB_SQUARE; ++i) {
      pre[i] = this->rng_.Rand8();
      wsrc[i] = this->rng_.Rand8() * this->rng_(kMaskMax * kMaskMax + 1);
      mask[i] = this->rng_(kMaskMax * kMaskMax + 1);
    }

    unsigned int ref_sse, tst_sse;
    const unsigned int ref_res =
        params_.ref_func(pre, pre_stride, wsrc, mask, &ref_sse);
    unsigned int tst_res;
    API_REGISTER_STATE_CHECK(
        tst_res = params_.tst_func(pre, pre_stride, wsrc, mask, &tst_sse));

    ASSERT_EQ(ref_res, tst_res);
    ASSERT_EQ(ref_sse, tst_sse);
  }
}